

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Interprocedural.cpp
# Opt level: O1

void dg::pta::LLVMPointerGraphBuilder::addReturnNodeOperand(PSNode *callNode,PSNode *ret)

{
  PSNode **ppPVar1;
  __normal_iterator<dg::pta::PSNode_*const_*,_std::vector<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>_>
  _Var2;
  PSNodeRet *this;
  PSNodeCallRet *this_00;
  
  this_00 = (PSNodeCallRet *)0x0;
  if ((((PSNodeCallRet *)callNode->pairedNode)->super_PSNode).type == CALL_RETURN) {
    this_00 = (PSNodeCallRet *)callNode->pairedNode;
  }
  ppPVar1 = (this_00->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.operands.
            super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<dg::pta::PSNode*const*,std::vector<dg::pta::PSNode*,std::allocator<dg::pta::PSNode*>>>,__gnu_cxx::__ops::_Iter_pred<dg::SubgraphNode<dg::pta::PSNode>::hasOperand(dg::pta::PSNode*)const::_lambda(dg::pta::PSNode*)_1_>>
                    ((this_00->super_PSNode).super_SubgraphNode<dg::pta::PSNode>.operands.
                     super__Vector_base<dg::pta::PSNode_*,_std::allocator<dg::pta::PSNode_*>_>.
                     _M_impl.super__Vector_impl_data._M_start,ppPVar1,ret);
  if (_Var2._M_current == ppPVar1) {
    SubgraphNode<dg::pta::PSNode>::addOperand<dg::pta::PSNode*,dg::pta::PSNode>
              (&(this_00->super_PSNode).super_SubgraphNode<dg::pta::PSNode>,ret);
  }
  this = (PSNodeRet *)0x0;
  if (ret->type == RETURN) {
    this = (PSNodeRet *)ret;
  }
  PSNodeRet::addReturnSite(this,&this_00->super_PSNode);
  PSNodeCallRet::addReturn(this_00,ret);
  return;
}

Assistant:

void LLVMPointerGraphBuilder::addReturnNodeOperand(PSNode *callNode,
                                                   PSNode *ret) {
    assert(PSNodeRet::get(ret));
    auto *callReturn = PSNodeCallRet::cast(callNode->getPairedNode());
    // the function must be defined, since we have the return node,
    // so there must be associated the return node
    assert(callReturn);
    assert(callReturn != callNode);
    assert(callReturn->getType() == PSNodeType::CALL_RETURN);

    if (!callReturn->hasOperand(ret))
        callReturn->addOperand(ret);

    // setup return edges (do it here, since recursive calls
    // may not have build return nodes earlier)
    PSNodeRet::get(ret)->addReturnSite(callReturn);
    callReturn->addReturn(ret);
}